

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::rust_struct_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_struct *tstruct)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_40 [8];
  string base_struct_name;
  t_struct *tstruct_local;
  t_rs_generator *this_local;
  
  base_struct_name.field_2._8_8_ = tstruct;
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  rust_camel_case((string *)local_40,this,(string *)CONCAT44(extraout_var,iVar1));
  rust_safe_name(__return_storage_ptr__,this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_struct_name(t_struct* tstruct) {
  string base_struct_name(rust_camel_case(tstruct->get_name()));
  return rust_safe_name(base_struct_name);
}